

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp analyze_seq(sexp ctx,sexp ls,int depth,int defok)

{
  sexp_gc_var_t *psVar1;
  sexp_gc_var_t *tag;
  sexp psVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  int in_stack_00000050;
  int in_stack_00000054;
  sexp in_stack_00000058;
  sexp in_stack_00000060;
  sexp_conflict *local_48;
  sexp_conflict size;
  sexp local_20 [2];
  
  local_20[0] = (sexp)0x43e;
  memset(&stack0xffffffffffffffd0,0,0x10);
  size = (sexp_conflict)0x43e;
  memset(&local_48,0,0x10);
  psVar1 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffd0;
  local_48 = (sexp_conflict *)&stack0xffffffffffffffc8;
  tag = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&local_48;
  if ((sexp)in_RSI == (sexp)&DAT_0000023e) {
    local_20[0] = (sexp)&DAT_0000043e;
    psVar2 = local_20[0];
  }
  else if ((((sexp)in_RSI)->value).type.cpl == (sexp)0x23e) {
    psVar2 = analyze(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000050);
  }
  else {
    local_20[0] = sexp_alloc_tagged_aux((sexp)local_20,(size_t)size,(sexp_uint_t)tag);
    (local_20[0]->value).type.cpl = (((sexp)in_RSI)->value).type.slots;
    psVar2 = analyze_list((sexp)__sexp_gc_preserver2.var,(sexp)in_RDI,(int)((ulong)in_RSI >> 0x20),
                          (int)in_RSI);
    if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
      (local_20[0]->value).type.name = psVar2;
      psVar2 = local_20[0];
    }
  }
  local_20[0] = psVar2;
  (((sexp)in_RDI)->value).context.saves = psVar1;
  return local_20[0];
}

Assistant:

static sexp analyze_seq (sexp ctx, sexp ls, int depth, int defok) {
  sexp_gc_var2(res, tmp);
  sexp_gc_preserve2(ctx, res, tmp);
  if (sexp_nullp(ls))
    res = SEXP_VOID;
  else if (sexp_nullp(sexp_cdr(ls)))
    res = analyze(ctx, sexp_car(ls), depth, defok);
  else {
    res = sexp_alloc_type(ctx, seq, SEXP_SEQ);
    sexp_seq_source(res) = sexp_pair_source(ls);
    tmp = analyze_list(ctx, ls, depth, defok);
    if (sexp_exceptionp(tmp))
      res = tmp;
    else
      sexp_seq_ls(res) = tmp;
  }
  sexp_gc_release2(ctx);
  return res;
}